

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::set_pattern
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,string *pattern)

{
  formatter *pfVar1;
  pattern_formatter *this_00;
  allocator<char> local_91;
  string local_90;
  string local_70;
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_50;
  
  this_00 = (pattern_formatter *)operator_new(0xe0);
  std::__cxx11::string::string
            ((string *)&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pattern);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"\n",&local_91);
  local_50._M_buckets = &local_50._M_single_bucket;
  local_50._M_bucket_count = 1;
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = 0;
  local_50._M_rehash_policy._M_max_load_factor = 1.0;
  local_50._M_rehash_policy._4_4_ = 0;
  local_50._M_rehash_policy._M_next_resize = 0;
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  pattern_formatter::pattern_formatter(this_00,&local_70,local,&local_90,(custom_flags *)&local_50);
  pfVar1 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (this->formatter_)._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)this_00;
  if (pfVar1 != (formatter *)0x0) {
    (*pfVar1->_vptr_formatter[1])();
  }
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_pattern(const std::string &pattern) {
    std::lock_guard<mutex_t> lock(mutex_);
    formatter_ = std::unique_ptr<spdlog::formatter>(new pattern_formatter(pattern));
}